

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O2

void __thiscall QIcon::addFile(QIcon *this,QString *fileName,QSize *size,Mode mode,State state)

{
  QIconEngine *pQVar1;
  QScreen **ppQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *pQVar8;
  Type *pTVar9;
  QObject *object;
  QIconEnginePlugin *pQVar10;
  QPixmapIconEngine *this_00;
  QIconPrivate *pQVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  long in_FS_OFFSET;
  qreal __x;
  double dVar15;
  QFileInfo info;
  undefined4 uStack_b4;
  QMimeDatabase local_98 [8];
  qreal sourceDevicePixelRatio;
  QArrayDataPointer<QScreen_*> local_88;
  undefined1 local_68 [24];
  undefined1 *local_50;
  undefined1 *puStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size == 0) goto LAB_0025a002;
  detach(this);
  pQVar11 = this->d;
  if (pQVar11 == (QIconPrivate *)0x0) {
    _info = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&info,(QString *)fileName);
    pQVar8 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *)
             local_68;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::suffix();
    if ((undefined1 **)local_68._16_8_ == (undefined1 **)0x0) {
      pQVar8 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *)
               local_98;
      QMimeDatabase::QMimeDatabase((QMimeDatabase *)pQVar8);
      QMimeDatabase::mimeTypeForFile((QMimeType *)&sourceDevicePixelRatio,pQVar8,&info,0);
      QMimeType::preferredSuffix();
      uVar5 = local_68._16_8_;
      uVar4 = local_68._8_8_;
      uVar3 = local_68._0_8_;
      local_68._0_8_ = local_88.d;
      local_68._8_8_ = local_88.ptr;
      local_88.d = (Data *)uVar3;
      local_88.ptr = (QScreen **)uVar4;
      local_68._16_8_ = local_88.size;
      local_88.size = uVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      QMimeType::~QMimeType((QMimeType *)&sourceDevicePixelRatio);
      QMimeDatabase::~QMimeDatabase((QMimeDatabase *)pQVar8);
      if ((undefined1 **)local_68._16_8_ != (undefined1 **)0x0) goto LAB_00259d6a;
LAB_00259dcd:
      this_00 = (QPixmapIconEngine *)0x0;
      bVar6 = true;
      bVar13 = 0;
    }
    else {
LAB_00259d6a:
      pQVar8 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_> *)
               QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_>::
               operator()(pQVar8);
      iVar7 = QFactoryLoader::indexOf((QString *)pQVar8);
      if (iVar7 == -1) goto LAB_00259dcd;
      pTVar9 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_iceLoader>_>::
               operator()(pQVar8);
      object = (QObject *)QFactoryLoader::instance((int)pTVar9);
      pQVar10 = QtPrivate::qobject_cast_helper<QIconEnginePlugin*,QObject>(object);
      if ((pQVar10 == (QIconEnginePlugin *)0x0) ||
         (this_00 = (QPixmapIconEngine *)(**(code **)(*(long *)pQVar10 + 0x60))(pQVar10,fileName),
         this_00 == (QPixmapIconEngine *)0x0)) goto LAB_00259dcd;
      iVar7 = (*(this_00->super_QIconEngine)._vptr_QIconEngine[0xd])(this_00);
      bVar13 = (byte)iVar7 ^ 1;
      bVar6 = false;
    }
    pQVar11 = (QIconPrivate *)operator_new(0x18);
    if (bVar6) {
      this_00 = (QPixmapIconEngine *)operator_new(0x20);
      QPixmapIconEngine::QPixmapIconEngine(this_00);
    }
    pQVar11->engine = &this_00->super_QIconEngine;
    (pQVar11->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    LOCK();
    UNLOCK();
    iVar7 = nextSerialNumCounter()::serial + 1;
    nextSerialNumCounter()::serial = nextSerialNumCounter()::serial + 1;
    pQVar11->serialNum = iVar7;
    pQVar11->detach_no = 0;
    pQVar11->is_mask = false;
    this->d = pQVar11;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    QFileInfo::~QFileInfo(&info);
    if (bVar13 == 0) {
      pQVar11 = this->d;
      goto LAB_00259e30;
    }
  }
  else {
LAB_00259e30:
    (*pQVar11->engine->_vptr_QIconEngine[6])(pQVar11->engine,fileName,size,(ulong)mode,(ulong)state)
    ;
  }
  (*this->d->engine->_vptr_QIconEngine[7])((QArrayDataPointer<char16_t> *)local_68);
  local_88.d = (Data *)0x3;
  local_88.ptr = (QScreen **)0x5c4a5f;
  bVar6 = ::operator==((QString *)local_68,(QLatin1StringView *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  if (!bVar6) {
    local_68._16_8_ = &local_50;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = (Data *)0x4;
    local_68._8_8_ = (QScreen **)0x0;
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (QScreen **)&DAT_aaaaaaaaaaaaaaaa;
    QGuiApplication::screens();
    ppQVar2 = local_88.ptr;
    lVar14 = local_88.size << 3;
    for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 8) {
      __x = QScreen::devicePixelRatio(*(QScreen **)((long)ppQVar2 + lVar12));
      dVar15 = ceil(__x);
      _info = (Data *)CONCAT44(uStack_b4,(int)dVar15);
      if ((0 < (int)dVar15) &&
         (bVar6 = QVLABase<int>::contains<int>((QVLABase<int> *)local_68,(int *)&info), !bVar6)) {
        QVarLengthArray<int,_4LL>::append((QVarLengthArray<int,_4LL> *)local_68,(int *)&info);
      }
    }
    std::__sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
              (local_68._16_8_,(undefined1 *)(local_68._16_8_ + local_68._8_8_ * 4));
    uVar3 = local_68._16_8_;
    sourceDevicePixelRatio = 1.79769313486232e+308;
    lVar12 = local_68._8_8_ << 2;
    for (lVar14 = 0; lVar12 != lVar14; lVar14 = lVar14 + 4) {
      if ((double)*(int *)(uVar3 + lVar14) < sourceDevicePixelRatio) {
        _info = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        qt_findAtNxFile((QString *)&info,fileName,(double)*(int *)(uVar3 + lVar14),
                        &sourceDevicePixelRatio);
        bVar6 = ::operator!=((QString *)&info,fileName);
        if (bVar6) {
          pQVar1 = this->d->engine;
          (*pQVar1->_vptr_QIconEngine[6])
                    (pQVar1,(QArrayDataPointer<char16_t> *)&info,size,(ulong)mode,(ulong)state);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
      }
    }
    QArrayDataPointer<QScreen_*>::~QArrayDataPointer(&local_88);
    QVarLengthArray<int,_4LL>::~QVarLengthArray((QVarLengthArray<int,_4LL> *)local_68);
  }
LAB_0025a002:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIcon::addFile(const QString &fileName, const QSize &size, Mode mode, State state)
{
    if (fileName.isEmpty())
        return;
    detach();
    bool alreadyAdded = false;
    if (!d) {

        QFileInfo info(fileName);
        QString suffix = info.suffix();
#if QT_CONFIG(mimetype)
        if (suffix.isEmpty())
            suffix = QMimeDatabase().mimeTypeForFile(info).preferredSuffix(); // determination from contents
#endif // mimetype
        QIconEngine *engine = iconEngineFromSuffix(fileName, suffix);
        if (engine)
            alreadyAdded = !engine->isNull();
        d = new QIconPrivate(engine ? engine : new QPixmapIconEngine);
    }
    if (!alreadyAdded)
        d->engine->addFile(fileName, size, mode, state);

    if (d->engine->key() == "svg"_L1)   // not needed and also not supported
        return;

    // Check if a "@Nx" file exists and add it.
    QVarLengthArray<int, 4> devicePixelRatios;
    const auto screens = qApp->screens();
    for (const auto *screen : screens) {
        const auto dpr = qCeil(screen->devicePixelRatio()); // qt_findAtNxFile only supports integer values
        if (dpr >= 1 && !devicePixelRatios.contains(dpr))
            devicePixelRatios.push_back(dpr);
    }
    std::sort(devicePixelRatios.begin(), devicePixelRatios.end(), std::greater<int>());
    qreal sourceDevicePixelRatio = std::numeric_limits<qreal>::max();
    for (const auto dpr : std::as_const(devicePixelRatios)) {
        if (dpr >= sourceDevicePixelRatio)
            continue;
        const QString atNxFileName = qt_findAtNxFile(fileName, dpr, &sourceDevicePixelRatio);
        if (atNxFileName != fileName)
            d->engine->addFile(atNxFileName, size, mode, state);
    }
}